

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,MemoryAccess access)

{
  anon_class_8_1_8991fb9c local_170;
  StepT local_168;
  anon_class_8_1_8991fb9c local_148;
  StepT local_140;
  anon_class_8_1_8991fb9c local_120;
  StepT local_118;
  anon_class_8_1_8991fb9c local_f8;
  ConditionalStepT local_f0;
  anon_class_8_1_8991fb9c local_d0;
  StepT local_c8;
  anon_class_8_1_8991fb9c local_a8;
  StepT local_a0;
  anon_class_8_1_8991fb9c local_80;
  StepT local_78;
  anon_class_8_1_8991fb9c local_48;
  StepT local_40;
  undefined1 local_1d;
  MemoryAccess local_1c;
  Mos6502 *pMStack_18;
  MemoryAccess access_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_1d = 0;
  local_1c = access;
  pMStack_18 = this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_48.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__0,void>
            ((function<void()> *)&local_40,&local_48);
  Pipeline::push(__return_storage_ptr__,&local_40);
  std::function<void_()>::~function(&local_40);
  local_80.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__1,void>
            ((function<void()> *)&local_78,&local_80);
  Pipeline::push(__return_storage_ptr__,&local_78);
  std::function<void_()>::~function(&local_78);
  local_a8.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__2,void>
            ((function<void()> *)&local_a0,&local_a8);
  Pipeline::push(__return_storage_ptr__,&local_a0);
  std::function<void_()>::~function(&local_a0);
  if (local_1c == Write) {
    local_d0.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__3,void>
              ((function<void()> *)&local_c8,&local_d0);
    Pipeline::push(__return_storage_ptr__,&local_c8);
    std::function<void_()>::~function(&local_c8);
  }
  else if (local_1c == Read) {
    local_f8.this = this;
    std::function<n_e_s::core::StepResult()>::
    function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__4,void>
              ((function<n_e_s::core::StepResult()> *)&local_f0,&local_f8);
    Pipeline::push_conditional(__return_storage_ptr__,&local_f0);
    std::function<n_e_s::core::StepResult_()>::~function(&local_f0);
  }
  else {
    local_120.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__5,void>
              ((function<void()> *)&local_118,&local_120);
    Pipeline::push(__return_storage_ptr__,&local_118);
    std::function<void_()>::~function(&local_118);
    local_148.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__6,void>
              ((function<void()> *)&local_140,&local_148);
    Pipeline::push(__return_storage_ptr__,&local_140);
    std::function<void_()>::~function(&local_140);
    local_170.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_indirect_indexed_addressing_steps(n_e_s::core::MemoryAccess)::__7,void>
              ((function<void()> *)&local_168,&local_170);
    Pipeline::push(__return_storage_ptr__,&local_168);
    std::function<void_()>::~function(&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_indirect_indexed_addressing_steps(
        const MemoryAccess access) {
    Pipeline result;
    result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
    result.push([this] { tmp2_ = mmu_->read_byte(tmp_); });
    result.push([this] {
        // The effective address is always fetched from zero page
        const uint16_t upper = mmu_->read_byte(static_cast<uint8_t>(tmp_ + 1u))
                               << 8u;
        const uint16_t address = upper | tmp2_;
        const uint8_t offset = registers_->y;

        is_crossing_page_boundary_ = cross_page(address, offset);
        effective_address_ = address + offset;
    });
    if (access == MemoryAccess::Write) {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
    } else if (access == MemoryAccess::Read) {
        result.push_conditional([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
                return StepResult::Continue;
            }
            return StepResult::Skip;
        });
    } else {
        result.push([this] {
            if (is_crossing_page_boundary_) {
                // The high byte of the effective address is invalid
                // at this time (smaller by $100), but a read is still
                // performed.
                mmu_->read_byte(
                        effective_address_ - static_cast<uint16_t>(0x0100));
            } else {
                // Extra read from effective address.
                mmu_->read_byte(effective_address_);
            }
        });
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] { mmu_->write_byte(effective_address_, tmp_); });
    }
    return result;
}